

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

longlong NULLCFile::FileSize(File *file)

{
  long __off;
  long res;
  long pos;
  File *file_local;
  
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    file_local = (File *)0x0;
  }
  else if (file->handle == (FILE *)0x0) {
    nullcThrowError("Cannot get size of a closed file.");
    file_local = (File *)0x0;
  }
  else {
    __off = ftell((FILE *)file->handle);
    fseek((FILE *)file->handle,0,2);
    file_local = (File *)ftell((FILE *)file->handle);
    fseek((FILE *)file->handle,__off,0);
  }
  return (longlong)file_local;
}

Assistant:

long long FileSize(File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot get size of a closed file.");
			return 0;
		}

		long pos = ftell(file->handle);
		fseek(file->handle, 0, SEEK_END);
		long res = ftell(file->handle);
		fseek(file->handle, pos, SEEK_SET);

		return res;
	}